

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O2

long * permute_dist(distribution *d,long stream)

{
  distribution *pdVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  uint c;
  
  if (d == (distribution *)0x0) {
    if (permute_dist::dist == (distribution *)0x0) {
      fputs("Bad call to permute_dist",_stderr);
      abort();
    }
    c = permute_dist::dist->count;
    plVar2 = (long *)0x0;
    pdVar1 = permute_dist::dist;
  }
  else {
    plVar2 = d->permute;
    c = d->count;
    pdVar1 = d;
    if (plVar2 == (long *)0x0) {
      plVar2 = (long *)malloc((long)(int)c * 8);
      d->permute = plVar2;
      if (plVar2 == (long *)0x0) {
        fprintf(_stderr,"Malloc failed at %s:%d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/permute.c"
                ,0x6b);
        exit(1);
      }
      uVar3 = 0;
      uVar4 = 0;
      if (0 < (int)c) {
        uVar4 = (ulong)c;
      }
      for (; pdVar1 = d, uVar4 != uVar3; uVar3 = uVar3 + 1) {
        plVar2[uVar3] = uVar3;
      }
    }
  }
  permute_dist::dist = pdVar1;
  plVar2 = permute(plVar2,c,stream);
  return plVar2;
}

Assistant:

long *
permute_dist(distribution *d, long stream)
	{
	static distribution *dist = NULL;
	int i;
	
	if (d != NULL)
		{
		if (d->permute == (long *)NULL)
			{
			d->permute = (long *)malloc(sizeof(long) * DIST_SIZE(d));
			MALLOC_CHECK(d->permute);
			for (i=0; i < DIST_SIZE(d); i++) 
				*(d->permute + i) = i;
			}
		dist = d;
		return(permute(dist->permute, DIST_SIZE(dist), stream));
		}
	
	
	if (dist != NULL)
		return(permute(NULL, DIST_SIZE(dist), stream));
	else
		INTERNAL_ERROR("Bad call to permute_dist");	
	}